

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 *puVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  Geometry *extraout_RDX;
  Geometry *extraout_RDX_00;
  Geometry *pGVar27;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  Scene *pSVar32;
  int iVar33;
  ulong uVar34;
  bool bVar35;
  float fVar36;
  uint uVar37;
  float fVar40;
  float fVar42;
  vint4 bi;
  undefined1 auVar38 [16];
  uint uVar41;
  uint uVar43;
  float fVar44;
  uint uVar45;
  undefined1 auVar39 [16];
  float fVar46;
  uint uVar47;
  uint uVar48;
  float fVar49;
  uint uVar50;
  uint uVar51;
  float fVar52;
  uint uVar53;
  uint uVar54;
  float fVar55;
  vint4 ai;
  float fVar56;
  uint uVar57;
  uint uVar58;
  float fVar59;
  uint uVar60;
  uint uVar62;
  uint uVar63;
  vint4 ai_1;
  undefined1 auVar61 [16];
  uint uVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  undefined4 local_a08;
  undefined4 uStack_a04;
  int local_9dc;
  Geometry *local_9d8;
  ulong local_9d0;
  ulong local_9c8;
  ulong local_9c0;
  ulong local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  ulong local_9a0;
  Geometry *local_998;
  Scene *local_990;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  uint local_8a8;
  uint uStack_8a4;
  uint uStack_8a0;
  uint uStack_89c;
  float local_838 [4];
  float local_828 [4];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  float local_7e8 [4];
  NodeRef stack [244];
  Geometry *pGVar26;
  
  auVar21 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar3 = ray->tfar, 0.0 <= fVar3)) {
    local_998 = (Geometry *)(stack + 1);
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar8 = (ray->org).field_0.m128[0];
    fVar9 = (ray->org).field_0.m128[1];
    fVar10 = (ray->org).field_0.m128[2];
    aVar4 = (ray->dir).field_0.field_1;
    fVar65 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar78 = 0.0;
    if (0.0 <= fVar65) {
      fVar78 = fVar65;
    }
    auVar38._4_4_ = -(uint)(ABS(aVar4.y) < DAT_01ff1d40._4_4_);
    auVar38._0_4_ = -(uint)(ABS(aVar4.x) < (float)DAT_01ff1d40);
    auVar38._8_4_ = -(uint)(ABS(aVar4.z) < DAT_01ff1d40._8_4_);
    auVar38._12_4_ = -(uint)(ABS(aVar4.field_3.w) < DAT_01ff1d40._12_4_);
    auVar61 = blendvps((undefined1  [16])aVar4,_DAT_01ff1d40,auVar38);
    auVar38 = rcpps(auVar38,auVar61);
    fVar65 = auVar38._0_4_;
    fVar67 = auVar38._4_4_;
    fVar69 = auVar38._8_4_;
    fVar65 = (1.0 - auVar61._0_4_ * fVar65) * fVar65 + fVar65;
    fVar67 = (1.0 - auVar61._4_4_ * fVar67) * fVar67 + fVar67;
    fVar69 = (1.0 - auVar61._8_4_ * fVar69) * fVar69 + fVar69;
    local_9a0 = (ulong)(fVar65 < 0.0) << 4;
    local_9a8 = (ulong)(fVar67 < 0.0) << 4 | 0x20;
    local_9b0 = (ulong)(fVar69 < 0.0) << 4 | 0x40;
    uVar24 = local_9a0 ^ 0x10;
    uVar28 = local_9a8 ^ 0x10;
    uVar34 = local_9b0 ^ 0x10;
    puVar22 = mm_lookupmask_ps;
    local_9c0 = uVar28;
    local_9c8 = uVar34;
    pGVar26 = (Geometry *)context;
    do {
      if (local_998 == (Geometry *)stack) {
        return;
      }
      pSVar32 = *(Scene **)&local_998[-1].field_0x58;
      local_998 = (Geometry *)&local_998[-1].field_0x58;
      do {
        if (((ulong)pSVar32 & 8) == 0) {
          pfVar2 = (float *)((long)&((Vec3fa *)
                                    ((long)&(pSVar32->super_AccelN).super_Accel.super_AccelData.
                                            bounds.bounds0 + 0x10))->field_0 + local_9a0);
          fVar36 = (*pfVar2 - fVar8) * fVar65;
          fVar40 = (pfVar2[1] - fVar8) * fVar65;
          fVar42 = (pfVar2[2] - fVar8) * fVar65;
          fVar44 = (pfVar2[3] - fVar8) * fVar65;
          pfVar2 = (float *)((long)&((Vec3fa *)
                                    ((long)&(pSVar32->super_AccelN).super_Accel.super_AccelData.
                                            bounds.bounds0 + 0x10))->field_0 + local_9a8);
          fVar46 = (*pfVar2 - fVar9) * fVar67;
          fVar49 = (pfVar2[1] - fVar9) * fVar67;
          fVar52 = (pfVar2[2] - fVar9) * fVar67;
          fVar56 = (pfVar2[3] - fVar9) * fVar67;
          uVar47 = (uint)((int)fVar46 < (int)fVar36) * (int)fVar36 |
                   (uint)((int)fVar46 >= (int)fVar36) * (int)fVar46;
          uVar50 = (uint)((int)fVar49 < (int)fVar40) * (int)fVar40 |
                   (uint)((int)fVar49 >= (int)fVar40) * (int)fVar49;
          uVar53 = (uint)((int)fVar52 < (int)fVar42) * (int)fVar42 |
                   (uint)((int)fVar52 >= (int)fVar42) * (int)fVar52;
          uVar57 = (uint)((int)fVar56 < (int)fVar44) * (int)fVar44 |
                   (uint)((int)fVar56 >= (int)fVar44) * (int)fVar56;
          pfVar2 = (float *)((long)&((Vec3fa *)
                                    ((long)&(pSVar32->super_AccelN).super_Accel.super_AccelData.
                                            bounds.bounds0 + 0x10))->field_0 + local_9b0);
          fVar36 = (*pfVar2 - fVar10) * fVar69;
          fVar40 = (pfVar2[1] - fVar10) * fVar69;
          fVar42 = (pfVar2[2] - fVar10) * fVar69;
          fVar44 = (pfVar2[3] - fVar10) * fVar69;
          uVar37 = (uint)((int)fVar36 < (int)fVar78) * (int)fVar78 |
                   (uint)((int)fVar36 >= (int)fVar78) * (int)fVar36;
          uVar41 = (uint)((int)fVar40 < (int)fVar78) * (int)fVar78 |
                   (uint)((int)fVar40 >= (int)fVar78) * (int)fVar40;
          uVar43 = (uint)((int)fVar42 < (int)fVar78) * (int)fVar78 |
                   (uint)((int)fVar42 >= (int)fVar78) * (int)fVar42;
          uVar45 = (uint)((int)fVar44 < (int)fVar78) * (int)fVar78 |
                   (uint)((int)fVar44 >= (int)fVar78) * (int)fVar44;
          pfVar2 = (float *)((long)&((Vec3fa *)
                                    ((long)&(pSVar32->super_AccelN).super_Accel.super_AccelData.
                                            bounds.bounds0 + 0x10))->field_0 + uVar24);
          fVar36 = (*pfVar2 - fVar8) * fVar65;
          fVar40 = (pfVar2[1] - fVar8) * fVar65;
          fVar42 = (pfVar2[2] - fVar8) * fVar65;
          fVar44 = (pfVar2[3] - fVar8) * fVar65;
          pfVar2 = (float *)((long)&((Vec3fa *)
                                    ((long)&(pSVar32->super_AccelN).super_Accel.super_AccelData.
                                            bounds.bounds0 + 0x10))->field_0 + uVar28);
          fVar46 = (*pfVar2 - fVar9) * fVar67;
          fVar49 = (pfVar2[1] - fVar9) * fVar67;
          fVar52 = (pfVar2[2] - fVar9) * fVar67;
          fVar56 = (pfVar2[3] - fVar9) * fVar67;
          uVar60 = (uint)((int)fVar36 < (int)fVar46) * (int)fVar36 |
                   (uint)((int)fVar36 >= (int)fVar46) * (int)fVar46;
          uVar62 = (uint)((int)fVar40 < (int)fVar49) * (int)fVar40 |
                   (uint)((int)fVar40 >= (int)fVar49) * (int)fVar49;
          uVar63 = (uint)((int)fVar42 < (int)fVar52) * (int)fVar42 |
                   (uint)((int)fVar42 >= (int)fVar52) * (int)fVar52;
          uVar64 = (uint)((int)fVar44 < (int)fVar56) * (int)fVar44 |
                   (uint)((int)fVar44 >= (int)fVar56) * (int)fVar56;
          pfVar2 = (float *)((long)&((Vec3fa *)
                                    ((long)&(pSVar32->super_AccelN).super_Accel.super_AccelData.
                                            bounds.bounds0 + 0x10))->field_0 + uVar34);
          fVar36 = (*pfVar2 - fVar10) * fVar69;
          fVar40 = (pfVar2[1] - fVar10) * fVar69;
          fVar42 = (pfVar2[2] - fVar10) * fVar69;
          fVar44 = (pfVar2[3] - fVar10) * fVar69;
          uVar48 = (uint)((int)fVar3 < (int)fVar36) * (int)fVar3 |
                   (uint)((int)fVar3 >= (int)fVar36) * (int)fVar36;
          uVar51 = (uint)((int)fVar3 < (int)fVar40) * (int)fVar3 |
                   (uint)((int)fVar3 >= (int)fVar40) * (int)fVar40;
          uVar54 = (uint)((int)fVar3 < (int)fVar42) * (int)fVar3 |
                   (uint)((int)fVar3 >= (int)fVar42) * (int)fVar42;
          uVar58 = (uint)((int)fVar3 < (int)fVar44) * (int)fVar3 |
                   (uint)((int)fVar3 >= (int)fVar44) * (int)fVar44;
          auVar61._0_4_ =
               -(uint)((int)(((int)uVar60 < (int)uVar48) * uVar60 |
                            ((int)uVar60 >= (int)uVar48) * uVar48) <
                      (int)(((int)uVar37 < (int)uVar47) * uVar47 |
                           ((int)uVar37 >= (int)uVar47) * uVar37));
          auVar61._4_4_ =
               -(uint)((int)(((int)uVar62 < (int)uVar51) * uVar62 |
                            ((int)uVar62 >= (int)uVar51) * uVar51) <
                      (int)(((int)uVar41 < (int)uVar50) * uVar50 |
                           ((int)uVar41 >= (int)uVar50) * uVar41));
          auVar61._8_4_ =
               -(uint)((int)(((int)uVar63 < (int)uVar54) * uVar63 |
                            ((int)uVar63 >= (int)uVar54) * uVar54) <
                      (int)(((int)uVar43 < (int)uVar53) * uVar53 |
                           ((int)uVar43 >= (int)uVar53) * uVar43));
          auVar61._12_4_ =
               -(uint)((int)(((int)uVar64 < (int)uVar58) * uVar64 |
                            ((int)uVar64 >= (int)uVar58) * uVar58) <
                      (int)(((int)uVar45 < (int)uVar57) * uVar57 |
                           ((int)uVar45 >= (int)uVar57) * uVar45));
          uVar37 = movmskps((int)puVar22,auVar61);
          puVar22 = (undefined1 *)((ulong)uVar37 ^ 0xf);
          unaff_RBX = (ulong)puVar22 & 0xff;
        }
        if (((ulong)pSVar32 & 8) == 0) {
          if (unaff_RBX == 0) {
            iVar33 = 4;
          }
          else {
            uVar31 = (ulong)pSVar32 & 0xfffffffffffffff0;
            lVar29 = 0;
            if (unaff_RBX != 0) {
              for (; (unaff_RBX >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
              }
            }
            iVar33 = 0;
            puVar22 = *(undefined1 **)(uVar31 + lVar29 * 8);
            uVar30 = unaff_RBX - 1 & unaff_RBX;
            pSVar32 = (Scene *)puVar22;
            if (uVar30 != 0) {
              (local_998->super_RefCount)._vptr_RefCount = (_func_int **)puVar22;
              lVar29 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              uVar23 = uVar30 - 1;
              while( true ) {
                local_998 = (Geometry *)&(local_998->super_RefCount).refCounter;
                pSVar32 = *(Scene **)(uVar31 + lVar29 * 8);
                uVar23 = uVar23 & uVar30;
                if (uVar23 == 0) break;
                (((atomic<unsigned_long> *)local_998)->super___atomic_base<unsigned_long>)._M_i =
                     (__int_type_conflict)pSVar32;
                lVar29 = 0;
                if (uVar23 != 0) {
                  for (; (uVar23 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                uVar30 = uVar23 - 1;
              }
              puVar22 = (undefined1 *)0x0;
              pGVar26 = (Geometry *)stack;
            }
          }
        }
        else {
          iVar33 = 6;
        }
      } while (iVar33 == 0);
      if (iVar33 == 6) {
        iVar33 = 0;
        local_9b8 = (ulong)((uint)pSVar32 & 0xf) - 8;
        bVar35 = local_9b8 != 0;
        if (bVar35) {
          uVar31 = (ulong)pSVar32 & 0xfffffffffffffff0;
          uVar30 = 0;
          do {
            lVar29 = uVar30 * 0xb0;
            pfVar2 = (float *)(uVar31 + 0x80 + lVar29);
            fVar36 = *pfVar2;
            fVar40 = pfVar2[1];
            fVar42 = pfVar2[2];
            fVar44 = pfVar2[3];
            pfVar2 = (float *)(uVar31 + 0x40 + lVar29);
            fVar46 = *pfVar2;
            fVar49 = pfVar2[1];
            fVar52 = pfVar2[2];
            fVar56 = pfVar2[3];
            pfVar2 = (float *)(uVar31 + 0x70 + lVar29);
            fVar84 = *pfVar2;
            fVar86 = pfVar2[1];
            fVar88 = pfVar2[2];
            fVar90 = pfVar2[3];
            pfVar2 = (float *)(uVar31 + 0x50 + lVar29);
            fVar76 = *pfVar2;
            fVar77 = pfVar2[1];
            fVar55 = pfVar2[2];
            fVar59 = pfVar2[3];
            fVar103 = fVar84 * fVar76 - fVar36 * fVar46;
            fVar104 = fVar86 * fVar77 - fVar40 * fVar49;
            fVar105 = fVar88 * fVar55 - fVar42 * fVar52;
            fVar106 = fVar90 * fVar59 - fVar44 * fVar56;
            pfVar2 = (float *)(uVar31 + 0x60 + lVar29);
            fVar11 = *pfVar2;
            fVar12 = pfVar2[1];
            fVar13 = pfVar2[2];
            fVar14 = pfVar2[3];
            pfVar2 = (float *)(uVar31 + lVar29);
            pfVar1 = (float *)(uVar31 + 0x10 + lVar29);
            fVar71 = (ray->org).field_0.m128[0];
            fVar75 = (ray->org).field_0.m128[1];
            fVar98 = (ray->org).field_0.m128[2];
            fVar82 = (ray->dir).field_0.m128[0];
            fVar15 = (ray->dir).field_0.m128[1];
            fVar16 = (ray->dir).field_0.m128[2];
            fVar66 = *pfVar2 - fVar71;
            fVar68 = pfVar2[1] - fVar71;
            fVar70 = pfVar2[2] - fVar71;
            fVar71 = pfVar2[3] - fVar71;
            fVar72 = *pfVar1 - fVar75;
            fVar73 = pfVar1[1] - fVar75;
            fVar74 = pfVar1[2] - fVar75;
            fVar75 = pfVar1[3] - fVar75;
            fVar99 = fVar66 * fVar15 - fVar82 * fVar72;
            fVar100 = fVar68 * fVar15 - fVar82 * fVar73;
            fVar101 = fVar70 * fVar15 - fVar82 * fVar74;
            fVar102 = fVar71 * fVar15 - fVar82 * fVar75;
            pfVar2 = (float *)(uVar31 + 0x30 + lVar29);
            fVar17 = *pfVar2;
            fVar18 = pfVar2[1];
            fVar19 = pfVar2[2];
            fVar20 = pfVar2[3];
            local_7f8._0_4_ = fVar36 * fVar17 - fVar76 * fVar11;
            local_7f8._4_4_ = fVar40 * fVar18 - fVar77 * fVar12;
            local_7f8._8_4_ = fVar42 * fVar19 - fVar55 * fVar13;
            local_7f8._12_4_ = fVar44 * fVar20 - fVar59 * fVar14;
            pfVar2 = (float *)(uVar31 + 0x20 + lVar29);
            fVar95 = *pfVar2 - fVar98;
            fVar96 = pfVar2[1] - fVar98;
            fVar97 = pfVar2[2] - fVar98;
            fVar98 = pfVar2[3] - fVar98;
            fVar91 = fVar82 * fVar95 - fVar66 * fVar16;
            fVar92 = fVar82 * fVar96 - fVar68 * fVar16;
            fVar93 = fVar82 * fVar97 - fVar70 * fVar16;
            fVar94 = fVar82 * fVar98 - fVar71 * fVar16;
            local_7e8[0] = fVar46 * fVar11 - fVar84 * fVar17;
            local_7e8[1] = fVar49 * fVar12 - fVar86 * fVar18;
            local_7e8[2] = fVar52 * fVar13 - fVar88 * fVar19;
            local_7e8[3] = fVar56 * fVar14 - fVar90 * fVar20;
            fVar83 = fVar16 * fVar72 - fVar15 * fVar95;
            fVar85 = fVar16 * fVar73 - fVar15 * fVar96;
            fVar87 = fVar16 * fVar74 - fVar15 * fVar97;
            fVar89 = fVar16 * fVar75 - fVar15 * fVar98;
            fVar79 = fVar15 * local_7f8._0_4_ + fVar16 * local_7e8[0] + fVar103 * fVar82;
            fVar80 = fVar15 * local_7f8._4_4_ + fVar16 * local_7e8[1] + fVar104 * fVar82;
            fVar81 = fVar15 * local_7f8._8_4_ + fVar16 * local_7e8[2] + fVar105 * fVar82;
            fVar82 = fVar15 * local_7f8._12_4_ + fVar16 * local_7e8[3] + fVar106 * fVar82;
            uVar41 = (uint)fVar79 & 0x80000000;
            uVar43 = (uint)fVar80 & 0x80000000;
            uVar45 = (uint)fVar81 & 0x80000000;
            uVar47 = (uint)fVar82 & 0x80000000;
            fVar36 = (float)((uint)(fVar11 * fVar83 + fVar84 * fVar91 + fVar36 * fVar99) ^ uVar41);
            fVar40 = (float)((uint)(fVar12 * fVar85 + fVar86 * fVar92 + fVar40 * fVar100) ^ uVar43);
            fVar42 = (float)((uint)(fVar13 * fVar87 + fVar88 * fVar93 + fVar42 * fVar101) ^ uVar45);
            fVar44 = (float)((uint)(fVar14 * fVar89 + fVar90 * fVar94 + fVar44 * fVar102) ^ uVar47);
            fVar84 = (float)((uint)(fVar83 * fVar17 + fVar91 * fVar46 + fVar99 * fVar76) ^ uVar41);
            fVar86 = (float)((uint)(fVar85 * fVar18 + fVar92 * fVar49 + fVar100 * fVar77) ^ uVar43);
            fVar88 = (float)((uint)(fVar87 * fVar19 + fVar93 * fVar52 + fVar101 * fVar55) ^ uVar45);
            fVar90 = (float)((uint)(fVar89 * fVar20 + fVar94 * fVar56 + fVar102 * fVar59) ^ uVar47);
            fVar46 = ABS(fVar79);
            fVar49 = ABS(fVar80);
            fVar52 = ABS(fVar81);
            fVar56 = ABS(fVar82);
            local_8a8 = auVar21._0_4_;
            uStack_8a4 = auVar21._4_4_;
            uStack_8a0 = auVar21._8_4_;
            uStack_89c = auVar21._12_4_;
            uVar48 = -(uint)(fVar36 + fVar84 <= fVar46) &
                     -(uint)((0.0 <= fVar84 && 0.0 <= fVar36) && fVar79 != 0.0) & local_8a8;
            uVar50 = -(uint)(fVar40 + fVar86 <= fVar49) &
                     -(uint)((0.0 <= fVar86 && 0.0 <= fVar40) && fVar80 != 0.0) & uStack_8a4;
            uVar51 = -(uint)(fVar42 + fVar88 <= fVar52) &
                     -(uint)((0.0 <= fVar88 && 0.0 <= fVar42) && fVar81 != 0.0) & uStack_8a0;
            uVar53 = -(uint)(fVar44 + fVar90 <= fVar56) &
                     -(uint)((0.0 <= fVar90 && 0.0 <= fVar44) && fVar82 != 0.0) & uStack_89c;
            auVar7._4_4_ = uVar50;
            auVar7._0_4_ = uVar48;
            auVar7._8_4_ = uVar51;
            auVar7._12_4_ = uVar53;
            uVar37 = movmskps((int)puVar22,auVar7);
            puVar22 = (undefined1 *)(ulong)uVar37;
            if (uVar37 != 0) {
              fVar42 = (float)(uVar41 ^ (uint)(fVar66 * fVar103 +
                                              fVar72 * local_7f8._0_4_ + fVar95 * local_7e8[0]));
              fVar44 = (float)(uVar43 ^ (uint)(fVar68 * fVar104 +
                                              fVar73 * local_7f8._4_4_ + fVar96 * local_7e8[1]));
              fVar76 = (float)(uVar45 ^ (uint)(fVar70 * fVar105 +
                                              fVar74 * local_7f8._8_4_ + fVar97 * local_7e8[2]));
              fVar77 = (float)(uVar47 ^ (uint)(fVar71 * fVar106 +
                                              fVar75 * local_7f8._12_4_ + fVar98 * local_7e8[3]));
              fVar36 = (ray->org).field_0.m128[3];
              fVar40 = ray->tfar;
              auVar39._0_4_ =
                   -(uint)(fVar36 * fVar46 < fVar42 && fVar42 <= fVar40 * fVar46) & uVar48;
              auVar39._4_4_ =
                   -(uint)(fVar36 * fVar49 < fVar44 && fVar44 <= fVar40 * fVar49) & uVar50;
              auVar39._8_4_ =
                   -(uint)(fVar36 * fVar52 < fVar76 && fVar76 <= fVar40 * fVar52) & uVar51;
              auVar39._12_4_ =
                   -(uint)(fVar36 * fVar56 < fVar77 && fVar77 <= fVar40 * fVar56) & uVar53;
              iVar25 = movmskps((int)pGVar26,auVar39);
              pGVar26 = (Geometry *)CONCAT44((int)((ulong)pGVar26 >> 0x20),iVar25);
              if (iVar25 != 0) {
                local_808._4_4_ = fVar104;
                local_808._0_4_ = fVar103;
                local_808._8_4_ = fVar105;
                local_808._12_4_ = fVar106;
                local_990 = context->scene;
                auVar6._4_4_ = fVar49;
                auVar6._0_4_ = fVar46;
                auVar6._8_4_ = fVar52;
                auVar6._12_4_ = fVar56;
                auVar38 = rcpps(local_808,auVar6);
                fVar36 = auVar38._0_4_;
                fVar40 = auVar38._4_4_;
                fVar55 = auVar38._8_4_;
                fVar59 = auVar38._12_4_;
                fVar36 = (1.0 - fVar46 * fVar36) * fVar36 + fVar36;
                fVar40 = (1.0 - fVar49 * fVar40) * fVar40 + fVar40;
                fVar55 = (1.0 - fVar52 * fVar55) * fVar55 + fVar55;
                fVar59 = (1.0 - fVar56 * fVar59) * fVar59 + fVar59;
                local_818[0] = fVar42 * fVar36;
                local_818[1] = fVar44 * fVar40;
                local_818[2] = fVar76 * fVar55;
                local_818[3] = fVar77 * fVar59;
                local_828[0] = fVar36 * fVar84;
                local_828[1] = fVar40 * fVar86;
                local_828[2] = fVar55 * fVar88;
                local_828[3] = fVar59 * fVar90;
                do {
                  local_a08 = SUB84(pGVar26,0);
                  uStack_a04 = (undefined4)((ulong)pGVar26 >> 0x20);
                  local_9d0 = 0;
                  if (pGVar26 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar26 >> local_9d0 & 1) == 0; local_9d0 = local_9d0 + 1) {
                    }
                  }
                  h.geomID = *(uint *)(lVar29 + uVar31 + 0x90 + local_9d0 * 4);
                  pGVar5 = (local_990->geometries).items[h.geomID].ptr;
                  pGVar27 = pGVar5;
                  if ((pGVar5->mask & ray->mask) == 0) {
                    uVar28 = (ulong)pGVar26 ^ 1L << (local_9d0 & 0x3f);
                    local_a08 = (undefined4)uVar28;
                    uStack_a04 = (undefined4)(uVar28 >> 0x20);
                    puVar22 = (undefined1 *)CONCAT71((int7)(local_9d0 >> 8),1);
                  }
                  else {
                    local_9d8 = (Geometry *)context->args;
                    if ((local_9d8->device == (Device *)0x0) &&
                       (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      puVar22 = (undefined1 *)0x0;
                      pGVar27 = local_9d8;
                    }
                    else {
                      args.context = context->user;
                      h.Ng.field_0.field_0.x = *(float *)(local_808 + local_9d0 * 4);
                      h.Ng.field_0.field_0.y = local_7e8[local_9d0 - 4];
                      h.Ng.field_0.field_0.z = local_7e8[local_9d0];
                      h.u = local_828[local_9d0 - 4];
                      h.v = local_828[local_9d0];
                      h.primID = *(uint *)(lVar29 + uVar31 + 0xa0 + local_9d0 * 4);
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      fVar36 = ray->tfar;
                      ray->tfar = local_818[local_9d0];
                      local_9dc = -1;
                      args.valid = &local_9dc;
                      args.geometryUserPtr = pGVar5->userPtr;
                      args.ray = (RTCRayN *)ray;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      if ((pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar5->occlusionFilterN)(&args), pGVar27 = extraout_RDX,
                         *args.valid != 0)) {
                        if (local_9d8->device != (Device *)0x0) {
                          if ((((ulong)(local_9d8->super_RefCount)._vptr_RefCount & 2) != 0) ||
                             (((pGVar5->field_8).field_0x2 & 0x40) != 0)) {
                            (*(code *)local_9d8->device)(&args);
                            pGVar27 = extraout_RDX_00;
                          }
                          if (*args.valid == 0) goto LAB_002227e7;
                        }
                        puVar22 = (undefined1 *)0x0;
                      }
                      else {
LAB_002227e7:
                        ray->tfar = fVar36;
                        uVar28 = (ulong)pGVar26 ^ 1L << (local_9d0 & 0x3f);
                        local_a08 = (undefined4)uVar28;
                        uStack_a04 = (undefined4)(uVar28 >> 0x20);
                        puVar22 = (undefined1 *)CONCAT71((int7)(uVar28 >> 8),1);
                      }
                    }
                  }
                  if ((char)puVar22 == '\0') {
                    pGVar26 = pGVar27;
                    uVar28 = local_9c0;
                    uVar34 = local_9c8;
                    if (bVar35) {
                      ray->tfar = -INFINITY;
                      iVar33 = 3;
                    }
                    goto LAB_0022288c;
                  }
                  pGVar26 = (Geometry *)CONCAT44(uStack_a04,local_a08);
                } while (pGVar26 != (Geometry *)0x0);
                pGVar26 = (Geometry *)0x0;
              }
            }
            uVar30 = uVar30 + 1;
            bVar35 = uVar30 < local_9b8;
            uVar28 = local_9c0;
            uVar34 = local_9c8;
          } while (uVar30 != local_9b8);
        }
      }
LAB_0022288c:
    } while (iVar33 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }